

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void __thiscall Diligent::FixedBlockMemoryAllocator::Free(FixedBlockMemoryAllocator *this,void *Ptr)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  char (*Args_1) [27];
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> __it;
  __hash_code __code;
  string msg;
  unsigned_long PageId;
  string local_48;
  char (*local_28) [27];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = (this->m_AddrToPageId)._M_h._M_bucket_count;
  uVar4 = (ulong)Ptr % uVar1;
  p_Var5 = (this->m_AddrToPageId)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)Ptr))
  {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var2[1]._M_nxt == (_Hash_node_base *)Ptr)) goto LAB_0051c8be;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0051c8be:
  if (p_Var6 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    FormatString<char[67]>
              (&local_48,
               (char (*) [67])"Address not found in the allocations list - double freeing memory?");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x102);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_28 = *(char (**) [27])((long)__it._M_cur + 0x10);
    Args_1 = (char (*) [27])
             ((long)(this->m_PagePool).
                    super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_PagePool).
                    super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (Args_1 <= local_28) {
      FormatString<char[26],char[27]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"PageId < m_PagePool.size()",Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0xf3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    MemoryPage::DeAllocate
              ((this->m_PagePool).
               super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)local_28,Ptr);
    local_48._M_dataplus._M_p = (pointer)&this->m_AvailablePages;
    std::
    _Hashtable<unsigned_long,unsigned_long,Diligent::STDAllocator<unsigned_long,Diligent::IMemoryAllocator>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,false>,Diligent::IMemoryAllocator>>>
              ((_Hashtable<unsigned_long,unsigned_long,Diligent::STDAllocator<unsigned_long,Diligent::IMemoryAllocator>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_48._M_dataplus._M_p,&local_28);
    std::
    _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->m_AddrToPageId)._M_h,(const_iterator)__it._M_cur);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void FixedBlockMemoryAllocator::Free(void* Ptr)
{
    std::lock_guard<std::mutex> LockGuard(m_Mutex);
    auto                        PageIdIt = m_AddrToPageId.find(Ptr);
    if (PageIdIt != m_AddrToPageId.end())
    {
        auto PageId = PageIdIt->second;
        VERIFY_EXPR(PageId < m_PagePool.size());
        m_PagePool[PageId].DeAllocate(Ptr);
        m_AvailablePages.insert(PageId);
        m_AddrToPageId.erase(PageIdIt);
        if (m_AvailablePages.size() > 1 && !m_PagePool[PageId].HasAllocations())
        {
            // In current implementation pages are never released!
            // Note that if we delete a page, all indices past it will be invalid

            //m_PagePool.erase(m_PagePool.begin() + PageId);
            //m_AvailablePages.erase(PageId);
        }
    }
    else
    {
        UNEXPECTED("Address not found in the allocations list - double freeing memory?");
    }
}